

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O3

bool __thiscall
RootIndexProxyModel::moveColumns
          (RootIndexProxyModel *this,QModelIndex *sourceParent,int sourceColumn,int count,
          QModelIndex *destinationParent,int destinationChild)

{
  RootIndexProxyModelPrivate *pRVar1;
  undefined1 uVar2;
  long lVar3;
  long *plVar4;
  QModelIndex local_60;
  QModelIndex local_48;
  
  lVar3 = QAbstractProxyModel::sourceModel();
  if (lVar3 == 0) {
    uVar2 = 0;
  }
  else {
    pRVar1 = this->m_dptr;
    local_48.r = -1;
    local_48.c = -1;
    local_48.i = 0;
    local_48.m = (QAbstractItemModel *)0x0;
    if (((sourceParent->r < 0) || (sourceParent->c < 0)) ||
       (sourceParent->m == (QAbstractItemModel *)0x0)) {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_48,&pRVar1->m_rootIndex);
    }
    else {
      (**(code **)(*(long *)this + 400))(&local_48,this,sourceParent);
    }
    local_60.r = -1;
    local_60.c = -1;
    local_60.i = 0;
    local_60.m = (QAbstractItemModel *)0x0;
    if (((destinationParent->r < 0) || (destinationParent->c < 0)) ||
       (destinationParent->m == (QAbstractItemModel *)0x0)) {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_60,&pRVar1->m_rootIndex);
    }
    else {
      (**(code **)(*(long *)this + 400))(&local_60,this,destinationParent);
    }
    plVar4 = (long *)QAbstractProxyModel::sourceModel();
    uVar2 = (**(code **)(*plVar4 + 0x120))
                      (plVar4,&local_48,sourceColumn,count,&local_60,destinationChild);
  }
  return (bool)uVar2;
}

Assistant:

bool RootIndexProxyModel::moveColumns(const QModelIndex &sourceParent, int sourceColumn, int count, const QModelIndex &destinationParent,
                                      int destinationChild)
{
    Q_ASSERT(!sourceParent.isValid() || sourceParent.model() == this);
    Q_ASSERT(!destinationParent.isValid() || destinationParent.model() == this);
    if (!sourceModel())
        return false;
    Q_D(RootIndexProxyModel);
    QModelIndex srcParent;
    if (sourceParent.isValid())
        srcParent = mapToSource(sourceParent);
    else
        srcParent = d->m_rootIndex;
    QModelIndex destParent;
    if (destinationParent.isValid())
        destParent = mapToSource(destinationParent);
    else
        destParent = d->m_rootIndex;
    return sourceModel()->moveColumns(srcParent, sourceColumn, count, destParent, destinationChild);
}